

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void av1_highbd_inv_txfm_add_sse4_1
               (tran_low_t *input,uint8_t *dest,int stride,TxfmParam *txfm_param)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  __m128i *palVar3;
  __m128i *palVar4;
  __m128i alVar5;
  byte bVar6;
  transform_1d_sse4_1 p_Var7;
  transform_1d_sse4_1 p_Var8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  longlong lVar12;
  int8_t *piVar13;
  int8_t *piVar14;
  int8_t *piVar15;
  int8_t *piVar16;
  TX_TYPE tx_type;
  ulong uVar17;
  uint uVar18;
  int *piVar19;
  undefined8 *puVar20;
  undefined1 (*pauVar21) [16];
  __m128i *palVar22;
  undefined8 *puVar23;
  bool bVar24;
  long lVar25;
  uint uVar26;
  byte bVar27;
  long lVar28;
  TX_SIZE tx_size;
  int *piVar29;
  undefined1 (*pauVar30) [16];
  __m128i *palVar31;
  int i;
  bool bVar32;
  short sVar33;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  __m128i round;
  undefined1 auVar34 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  short sVar44;
  undefined1 in_XMM1 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ushort uVar47;
  int iVar49;
  ushort uVar60;
  ushort uVar61;
  int iVar62;
  ushort uVar63;
  ushort uVar64;
  int iVar65;
  ushort uVar66;
  ushort uVar67;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  short sVar69;
  undefined1 auVar56 [16];
  int iVar68;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  ushort uVar70;
  int iVar71;
  int iVar77;
  int iVar78;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int iVar79;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  __m128i alVar76;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  __m128i buf1 [16];
  byte local_258;
  undefined8 local_238;
  int aiStack_230 [2];
  undefined4 local_228 [8];
  int local_208 [4];
  longlong local_1f8 [2];
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  longlong local_1c8 [16];
  undefined8 auStack_148 [2];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108 [2];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  short sVar48;
  undefined1 auVar54 [16];
  
  piVar16 = av1_inv_txfm_shift_ls[0xe];
  piVar15 = av1_inv_txfm_shift_ls[0xd];
  piVar14 = av1_inv_txfm_shift_ls[6];
  piVar13 = av1_inv_txfm_shift_ls[5];
  tx_size = txfm_param->tx_size;
  switch(tx_size) {
  case '\0':
    if (txfm_param->lossless != 0) {
      av1_highbd_iwht4x4_add(input,dest,stride,txfm_param->eob,txfm_param->bd);
      return;
    }
    av1_inv_txfm2d_add_4x4_sse4_1
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\x01':
    iVar77 = txfm_param->bd;
    tx_type = txfm_param->tx_type;
    if (6 < (byte)(tx_type - 9)) {
      av1_inv_txfm2d_add_8x8_sse4_1(input,(uint16_t *)((long)dest * 2),stride,tx_type,iVar77);
      return;
    }
    iVar71 = txfm_param->eob;
    tx_size = '\x01';
    goto LAB_003fee50;
  default:
    tx_type = txfm_param->tx_type;
    iVar77 = txfm_param->bd;
    iVar71 = txfm_param->eob;
LAB_003fee50:
    av1_highbd_inv_txfm2d_add_universe_sse4_1(input,dest,stride,tx_type,tx_size,iVar71,iVar77);
    break;
  case '\x05':
    uVar26 = txfm_param->bd;
    bVar6 = txfm_param->tx_type;
    uVar17 = (ulong)bVar6;
    bVar32 = 0xf < uVar17;
    puVar20 = (undefined8 *)((long)dest * 2);
    p_Var7 = highbd_txfm_all_1d_zeros_w8_arr[0][""[uVar17]][0];
    uVar18 = 0xbeaf >> (bVar6 & 0x1f);
    p_Var8 = highbd_txfm_all_1d_zeros_w8_arr[1][""[uVar17]][1];
    lVar25 = 0;
    do {
      puVar23 = (undefined8 *)((long)input + lVar25 * 2);
      auVar34._0_8_ = puVar23[1];
      *(undefined8 *)((long)&local_238 + lVar25) = *puVar23;
      *(undefined8 *)((long)aiStack_230 + lVar25) = auVar34._0_8_;
      lVar25 = lVar25 + 0x10;
    } while (lVar25 != 0x40);
    palVar31 = &local_1f8;
    lVar25 = 0;
    do {
      auVar56 = *(undefined1 (*) [16])((long)input + lVar25 * 2 + 0x10);
      *(undefined1 (*) [16])((long)local_1f8 + lVar25) = auVar56;
      lVar25 = lVar25 + 0x10;
    } while (lVar25 != 0x40);
    lVar25 = 0;
    auVar56 = pmovsxwd(auVar56,0xb500b500b500b50);
    auVar73 = pmovsxwd(in_XMM1,0x800080008000800);
    do {
      auVar51 = pmulld(*(undefined1 (*) [16])((long)&local_238 + lVar25),auVar56);
      *(int *)((long)&local_238 + lVar25) = auVar51._0_4_ + auVar73._0_4_ >> 0xc;
      *(int *)((long)&local_238 + lVar25 + 4) = auVar51._4_4_ + auVar73._4_4_ >> 0xc;
      *(int *)((long)aiStack_230 + lVar25) = auVar51._8_4_ + auVar73._8_4_ >> 0xc;
      *(int *)((long)aiStack_230 + lVar25 + 4) = auVar51._12_4_ + auVar73._12_4_ >> 0xc;
      lVar25 = lVar25 + 0x10;
    } while (lVar25 != 0x80);
    (*p_Var7)((__m128i *)&local_238,(__m128i *)&local_238,0xc,0,uVar26,
              -(int)*av1_inv_txfm_shift_ls[5]);
    (*p_Var7)(palVar31,palVar31,0xc,0,uVar26,-(int)*piVar13);
    if ((0x7f1fU >> (bVar6 & 0x1f) & 1) == 0 && !bVar32) {
      local_138 = CONCAT44(local_228[4],local_208[0]);
      auVar37._0_8_ = CONCAT44(local_228[6],local_208[2]);
      auVar37._8_4_ = local_208[3];
      auVar37._12_4_ = local_228[7];
      uStack_130 = CONCAT44((undefined4)local_238,local_228[0]);
      local_108[0] = auVar37._8_8_;
      auVar84._0_8_ = local_1c8[0];
      auVar84._8_4_ = local_1c8[0]._4_4_;
      auVar84._12_4_ = uStack_1d4;
      local_e8 = auVar84._8_8_;
      local_f8 = CONCAT44(local_1d8,(int)local_1c8[0]);
      auVar50._4_4_ = uStack_1d0;
      auVar50._0_4_ = (int)local_1c8[1];
      auVar50._8_4_ = local_1c8[1]._4_4_;
      auVar50._12_4_ = uStack_1cc;
      local_238._4_4_ = local_208[1];
      local_228[1] = local_228[5];
      auVar34._0_8_ = auVar37._0_8_;
      local_1d8 = local_1e8;
      uStack_1d0 = uStack_1e0;
      uStack_1cc = uStack_1dc;
      local_228[6] = local_228[2];
      local_208[2] = aiStack_230[0];
    }
    else {
      palVar31 = (__m128i *)local_1c8;
      local_138 = CONCAT44(local_228[0],(undefined4)local_238);
      auVar34._0_8_ = CONCAT44(local_228[2],aiStack_230[0]);
      auVar34._8_4_ = aiStack_230[1];
      auVar34._12_4_ = local_228[3];
      uStack_130 = CONCAT44(local_208[0],local_228[4]);
      local_108[0] = auVar34._8_8_;
      auVar80._0_8_ = local_1f8[0];
      auVar80._8_4_ = local_1f8[0]._4_4_;
      auVar80._12_4_ = uStack_1e4;
      local_e8 = auVar80._8_8_;
      local_f8 = CONCAT44(local_1e8,(int)local_1f8[0]);
      auVar50._4_4_ = uStack_1e0;
      auVar50._0_4_ = (int)local_1f8[1];
      auVar50._8_4_ = local_1f8[1]._4_4_;
      auVar50._12_4_ = uStack_1dc;
    }
    uStack_120 = local_238._4_4_;
    uStack_11c = local_228[1];
    local_118 = auVar34._0_8_;
    uStack_110._0_4_ = local_228[6];
    uStack_110._4_4_ = local_208[2];
    uStack_f0 = CONCAT44((int)(*palVar31)[0],local_1d8);
    auVar86._0_8_ = CONCAT44((int)(*palVar31)[1],uStack_1d0);
    auVar86._8_4_ = uStack_1cc;
    auVar86._12_4_ = *(undefined4 *)((long)*palVar31 + 0xc);
    local_d8 = auVar50._0_8_;
    auVar52._8_8_ = auVar86._8_8_;
    auVar52._0_8_ = auVar50._8_8_;
    uStack_d0 = auVar86._0_8_;
    local_c8 = auVar52;
    (*p_Var8)((__m128i *)&local_138,(__m128i *)&local_138,0xc,1,uVar26,0);
    bVar6 = piVar13[1];
    if ((char)bVar6 < '\0') {
      iVar77 = 1 << (~bVar6 & 0x1f);
      lVar25 = 0;
      auVar45 = ZEXT416((uint)-(int)(char)bVar6);
      do {
        auVar52._0_4_ = *(int *)((long)&local_138 + lVar25) + iVar77 >> auVar45;
        auVar52._4_4_ = *(int *)((long)&local_138 + lVar25 + 4) + iVar77 >> auVar45;
        auVar52._8_4_ = *(int *)((long)&uStack_130 + lVar25) + iVar77 >> auVar45;
        auVar52._12_4_ = *(int *)((long)&uStack_130 + lVar25 + 4) + iVar77 >> auVar45;
        *(undefined1 (*) [16])((long)&local_138 + lVar25) = auVar52;
        lVar25 = lVar25 + 0x10;
      } while (lVar25 != 0x80);
    }
    else {
      lVar25 = 0;
      do {
        auVar45._0_4_ = *(int *)((long)&local_138 + lVar25) << (int)(char)bVar6;
        auVar45._4_4_ = *(undefined4 *)((long)&local_138 + lVar25 + 4);
        auVar45._8_4_ = *(undefined4 *)((long)&uStack_130 + lVar25);
        auVar45._12_4_ = *(undefined4 *)((long)&uStack_130 + lVar25 + 4);
        *(undefined1 (*) [16])((long)&local_138 + lVar25) = auVar45;
        lVar25 = lVar25 + 0x10;
      } while (lVar25 != 0x80);
    }
    auVar56 = pmovsxbw(auVar45,0x101010101010101);
    auVar56 = psllw(auVar56,ZEXT416(uVar26));
    lVar25 = 0x70;
    if ((uVar18 & 1) != 0 || bVar32) {
      lVar25 = 0;
    }
    sVar33 = auVar56._0_2_ + -1;
    sVar38 = auVar56._2_2_ + -1;
    sVar39 = auVar56._4_2_ + -1;
    sVar40 = auVar56._6_2_ + -1;
    sVar41 = auVar56._8_2_ + -1;
    sVar42 = auVar56._10_2_ + -1;
    sVar43 = auVar56._12_2_ + -1;
    sVar44 = auVar56._14_2_ + -1;
    piVar19 = (int *)((long)&local_138 + lVar25);
    lVar25 = 8;
    do {
      auVar56 = pmovsxwd(auVar52,*puVar20);
      auVar55._0_4_ = auVar56._0_4_ + *piVar19;
      auVar55._4_4_ = auVar56._4_4_ + piVar19[1];
      auVar55._8_4_ = auVar56._8_4_ + piVar19[2];
      auVar55._12_4_ = auVar56._12_4_ + piVar19[3];
      auVar56 = packusdw(auVar55,auVar55);
      sVar48 = auVar56._0_2_;
      uVar47 = (ushort)(sVar33 < sVar48) * sVar33 | (ushort)(sVar33 >= sVar48) * sVar48;
      sVar48 = auVar56._2_2_;
      uVar60 = (ushort)(sVar38 < sVar48) * sVar38 | (ushort)(sVar38 >= sVar48) * sVar48;
      sVar48 = auVar56._4_2_;
      uVar61 = (ushort)(sVar39 < sVar48) * sVar39 | (ushort)(sVar39 >= sVar48) * sVar48;
      sVar48 = auVar56._6_2_;
      uVar63 = (ushort)(sVar40 < sVar48) * sVar40 | (ushort)(sVar40 >= sVar48) * sVar48;
      sVar48 = auVar56._8_2_;
      uVar64 = (ushort)(sVar41 < sVar48) * sVar41 | (ushort)(sVar41 >= sVar48) * sVar48;
      sVar48 = auVar56._10_2_;
      uVar66 = (ushort)(sVar42 < sVar48) * sVar42 | (ushort)(sVar42 >= sVar48) * sVar48;
      sVar48 = auVar56._12_2_;
      sVar69 = auVar56._14_2_;
      uVar67 = (ushort)(sVar43 < sVar48) * sVar43 | (ushort)(sVar43 >= sVar48) * sVar48;
      uVar70 = (ushort)(sVar44 < sVar69) * sVar44 | (ushort)(sVar44 >= sVar69) * sVar69;
      auVar52._0_8_ =
           CONCAT26((-1 < (short)uVar63) * uVar63,
                    CONCAT24((-1 < (short)uVar61) * uVar61,
                             CONCAT22((-1 < (short)uVar60) * uVar60,(-1 < (short)uVar47) * uVar47)))
      ;
      auVar52._8_2_ = (-1 < (short)uVar64) * uVar64;
      auVar52._10_2_ = (-1 < (short)uVar66) * uVar66;
      auVar52._12_2_ = (-1 < (short)uVar67) * uVar67;
      auVar52._14_2_ = (-1 < (short)uVar70) * uVar70;
      *puVar20 = auVar52._0_8_;
      puVar20 = (undefined8 *)((long)puVar20 + (long)stride * 2);
      piVar19 = (int *)((long)piVar19 + ((ulong)(((byte)((byte)uVar18 | bVar32) & 1) << 5) - 0x10));
      lVar25 = lVar25 + -1;
    } while (lVar25 != 0);
    break;
  case '\x06':
    iVar77 = txfm_param->bd;
    bVar6 = txfm_param->tx_type;
    uVar17 = (ulong)bVar6;
    palVar22 = (__m128i *)((long)dest * 2);
    p_Var7 = highbd_txfm_all_1d_zeros_w8_arr[1][""[uVar17]][1];
    p_Var8 = highbd_txfm_all_1d_zeros_w8_arr[0][""[uVar17]][0];
    bVar27 = (byte)(0xbeaf >> (bVar6 & 0x1f)) | 0xf < uVar17;
    palVar31 = (__m128i *)&local_238;
    memcpy(palVar31,input,0x80);
    lVar25 = 0;
    auVar56 = pmovsxwd(extraout_XMM0,0xb500b500b500b50);
    auVar73 = pmovsxwd(in_XMM1,0x800080008000800);
    do {
      auVar51 = pmulld(*(undefined1 (*) [16])((long)&local_238 + lVar25),auVar56);
      *(int *)((long)&local_238 + lVar25) = auVar51._0_4_ + auVar73._0_4_ >> 0xc;
      *(int *)((long)&local_238 + lVar25 + 4) = auVar51._4_4_ + auVar73._4_4_ >> 0xc;
      *(int *)((long)aiStack_230 + lVar25) = auVar51._8_4_ + auVar73._8_4_ >> 0xc;
      *(int *)((long)aiStack_230 + lVar25 + 4) = auVar51._12_4_ + auVar73._12_4_ >> 0xc;
      lVar25 = lVar25 + 0x10;
    } while (lVar25 != 0x80);
    (*p_Var7)(palVar31,palVar31,0xc,0,iVar77,-(int)*piVar14);
    if ((0x7f1fU >> (bVar6 & 0x1f) & 1) == 0 && 0xf >= uVar17) {
      lVar25 = 0x80;
      puVar20 = &local_238;
      palVar31 = (__m128i *)&local_138;
      do {
        auVar34._0_8_ = puVar20[1];
        *(undefined8 *)((long)auStack_148 + lVar25) = *puVar20;
        *(undefined8 *)((long)auStack_148 + lVar25 + 8) = auVar34._0_8_;
        puVar20 = puVar20 + 2;
        lVar25 = lVar25 + -0x10;
      } while (lVar25 != 0);
    }
    lVar25 = 0;
    bVar32 = true;
    do {
      bVar24 = bVar32;
      alVar5 = palVar31[lVar25];
      palVar3 = palVar31 + lVar25 + 1;
      palVar4 = palVar31 + lVar25 + 2;
      uVar9 = *(undefined4 *)((long)*palVar4 + 4);
      lVar12 = (*palVar4)[1];
      uVar10 = *(undefined4 *)((long)*palVar4 + 0xc);
      alVar76 = palVar31[lVar25 + 3];
      auVar82._0_8_ = alVar5[0];
      auVar82._8_4_ = alVar5[0]._4_4_;
      auVar82._12_4_ = *(undefined4 *)((long)*palVar3 + 4);
      auVar35._0_8_ = CONCAT44((int)(*palVar3)[1],(int)alVar5[1]);
      auVar35._8_4_ = alVar5[1]._4_4_;
      auVar35._12_4_ = *(undefined4 *)((long)*palVar3 + 0xc);
      palVar31[lVar25][0] = CONCAT44((int)(*palVar3)[0],(int)alVar5[0]);
      palVar31[lVar25][1] = CONCAT44((int)alVar76[0],(int)(*palVar4)[0]);
      palVar3 = palVar31 + lVar25 + 1;
      (*palVar3)[0] = auVar82._8_8_;
      *(undefined4 *)palVar3[1] = uVar9;
      *(int *)((long)palVar3[1] + 4) = alVar76[0]._4_4_;
      palVar3 = palVar31 + lVar25 + 2;
      (*palVar3)[0] = auVar35._0_8_;
      *(int *)(*palVar3 + 1) = (int)lVar12;
      *(int *)((long)*palVar3 + 0xc) = (int)alVar76[1];
      palVar3 = palVar31 + lVar25 + 3;
      (*palVar3)[0] = auVar35._8_8_;
      *(undefined4 *)palVar3[1] = uVar10;
      *(int *)((long)palVar3[1] + 4) = alVar76[1]._4_4_;
      (*p_Var8)(palVar31 + lVar25,palVar31 + lVar25,0xc,1,iVar77,0);
      lVar25 = 4;
      bVar32 = false;
    } while (bVar24);
    bVar6 = piVar14[1];
    if ((char)bVar6 < '\0') {
      iVar71 = 1 << (~bVar6 & 0x1f);
      lVar25 = 0;
      auVar56 = ZEXT416((uint)-(int)(char)bVar6);
      do {
        piVar19 = (int *)((long)*palVar31 + lVar25);
        iVar79 = piVar19[1];
        iVar78 = piVar19[2];
        iVar49 = piVar19[3];
        piVar29 = (int *)((long)*palVar31 + lVar25);
        *piVar29 = *piVar19 + iVar71 >> auVar56;
        piVar29[1] = iVar79 + iVar71 >> auVar56;
        piVar29[2] = iVar78 + iVar71 >> auVar56;
        piVar29[3] = iVar49 + iVar71 >> auVar56;
        lVar25 = lVar25 + 0x10;
      } while (lVar25 != 0x80);
    }
    else {
      lVar25 = 0;
      do {
        piVar19 = (int *)((long)*palVar31 + lVar25);
        iVar71 = piVar19[1];
        iVar79 = piVar19[2];
        iVar78 = piVar19[3];
        piVar29 = (int *)((long)*palVar31 + lVar25);
        *piVar29 = *piVar19 << (int)(char)bVar6;
        piVar29[1] = iVar71;
        piVar29[2] = iVar79;
        piVar29[3] = iVar78;
        lVar25 = lVar25 + 0x10;
      } while (lVar25 != 0x80);
    }
    uVar26 = ~(-1 << ((byte)iVar77 & 0x1f));
    piVar19 = (int *)((long)palVar31[4] + (ulong)(((byte)~bVar27 & 1) * 0x30));
    lVar25 = 4;
    do {
      alVar5 = *palVar22;
      auVar56 = pmovsxwd((undefined1  [16])alVar76,(undefined1  [16])alVar5);
      auVar57._8_4_ = (undefined4)alVar5[1];
      auVar57._12_4_ = alVar5[1]._4_4_;
      auVar57._0_8_ = alVar5[1];
      iVar78 = auVar56._0_4_ + piVar19[-0x10];
      iVar79 = auVar56._4_4_ + piVar19[-0xf];
      iVar71 = auVar56._8_4_ + piVar19[-0xe];
      iVar77 = auVar56._12_4_ + piVar19[-0xd];
      auVar56 = pmovsxwd(auVar57,auVar57);
      iVar62 = auVar56._0_4_ + *piVar19;
      iVar65 = auVar56._4_4_ + piVar19[1];
      iVar49 = auVar56._8_4_ + piVar19[2];
      iVar68 = auVar56._12_4_ + piVar19[3];
      iVar78 = (uint)(-1 < iVar78) * iVar78;
      iVar79 = (uint)(-1 < iVar79) * iVar79;
      iVar71 = (uint)(-1 < iVar71) * iVar71;
      iVar77 = (uint)(-1 < iVar77) * iVar77;
      auVar75._0_4_ = ((int)uVar26 < iVar78) * uVar26 | (uint)((int)uVar26 >= iVar78) * iVar78;
      auVar75._4_4_ = ((int)uVar26 < iVar79) * uVar26 | (uint)((int)uVar26 >= iVar79) * iVar79;
      auVar75._8_4_ = ((int)uVar26 < iVar71) * uVar26 | (uint)((int)uVar26 >= iVar71) * iVar71;
      auVar75._12_4_ = ((int)uVar26 < iVar77) * uVar26 | (uint)((int)uVar26 >= iVar77) * iVar77;
      iVar62 = (uint)(-1 < iVar62) * iVar62;
      iVar65 = (uint)(-1 < iVar65) * iVar65;
      iVar49 = (uint)(-1 < iVar49) * iVar49;
      iVar68 = (uint)(-1 < iVar68) * iVar68;
      auVar58._0_4_ = ((int)uVar26 < iVar62) * uVar26 | (uint)((int)uVar26 >= iVar62) * iVar62;
      auVar58._4_4_ = ((int)uVar26 < iVar65) * uVar26 | (uint)((int)uVar26 >= iVar65) * iVar65;
      auVar58._8_4_ = ((int)uVar26 < iVar49) * uVar26 | (uint)((int)uVar26 >= iVar49) * iVar49;
      auVar58._12_4_ = ((int)uVar26 < iVar68) * uVar26 | (uint)((int)uVar26 >= iVar68) * iVar68;
      alVar76 = (__m128i)packusdw(auVar75,auVar58);
      *palVar22 = alVar76;
      palVar22 = (__m128i *)((long)*palVar22 + (long)stride * 2);
      piVar19 = (int *)((long)piVar19 + ((ulong)((bVar27 & 1) << 5) - 0x10));
      lVar25 = lVar25 + -1;
    } while (lVar25 != 0);
    break;
  case '\r':
    uVar26 = txfm_param->bd;
    bVar6 = txfm_param->tx_type;
    uVar17 = (ulong)bVar6;
    bVar32 = 0xf < uVar17;
    puVar23 = (undefined8 *)((long)dest * 2);
    p_Var7 = highbd_txfm_all_1d_zeros_w8_arr[0][""[uVar17]][0];
    p_Var8 = highbd_txfm_all_1d_zeros_w8_arr[2][""[uVar17]][2];
    uVar18 = 0xbeaf >> (bVar6 & 0x1f);
    puVar20 = &local_238;
    lVar25 = 0;
    do {
      lVar28 = 0;
      do {
        auVar34._0_8_ = *(undefined8 *)(input + lVar28 + 2);
        *(undefined8 *)((long)puVar20 + lVar28) = *(undefined8 *)(input + lVar28);
        ((undefined8 *)((long)puVar20 + lVar28))[1] = auVar34._0_8_;
        lVar28 = lVar28 + 0x10;
      } while (lVar28 != 0x40);
      (*p_Var7)((__m128i *)(&local_238 + lVar25 * 8),(__m128i *)(&local_238 + lVar25 * 8),0xc,0,
                uVar26,-(int)*piVar15);
      lVar25 = lVar25 + 1;
      input = input + 4;
      puVar20 = puVar20 + 8;
    } while (lVar25 != 4);
    if ((0x7f1fU >> (bVar6 & 0x1f) & 1) == 0 && !bVar32) {
      lVar25 = 0;
      do {
        uVar9 = *(undefined4 *)((long)aiStack_230 + lVar25 + 4);
        auVar56 = *(undefined1 (*) [16])((long)local_228 + lVar25);
        auVar73 = *(undefined1 (*) [16])((long)local_208 + lVar25);
        auVar85._0_8_ = auVar73._0_8_;
        auVar85._8_4_ = auVar73._4_4_;
        auVar85._12_4_ = *(undefined4 *)((long)local_228 + lVar25 + 0x14);
        auVar72._0_8_ = CONCAT44(*(undefined4 *)((long)local_228 + lVar25 + 0x18),auVar73._8_4_);
        auVar72._8_4_ = auVar73._12_4_;
        auVar72._12_4_ = *(undefined4 *)((long)local_228 + lVar25 + 0x1c);
        auVar54._0_8_ = auVar56._0_8_;
        auVar54._8_4_ = auVar56._4_4_;
        auVar54._12_4_ = *(undefined4 *)((long)&local_238 + lVar25 + 4);
        auVar53._8_8_ = auVar54._8_8_;
        auVar53._0_8_ = CONCAT44(*(undefined4 *)((long)&local_238 + lVar25),auVar56._0_4_);
        *(ulong *)((long)&local_138 + lVar25) =
             CONCAT44(*(undefined4 *)((long)local_228 + lVar25 + 0x10),auVar73._0_4_);
        *(undefined8 *)((long)&uStack_130 + lVar25) = auVar53._0_8_;
        *(long *)((long)&local_128 + lVar25) = auVar85._8_8_;
        *(undefined8 *)((long)&uStack_120 + lVar25) = auVar53._8_8_;
        *(undefined8 *)((long)&local_118 + lVar25) = auVar72._0_8_;
        *(int *)((long)&uStack_110 + lVar25) = auVar56._8_4_;
        *(undefined4 *)((long)local_108 + lVar25 + -4) = *(undefined4 *)((long)aiStack_230 + lVar25)
        ;
        *(long *)((long)local_108 + lVar25) = auVar72._8_8_;
        *(int *)((long)&local_f8 + lVar25) = auVar56._12_4_;
        *(undefined4 *)((long)&local_f8 + lVar25 + 4) = uVar9;
        lVar25 = lVar25 + 0x40;
      } while (lVar25 != 0x100);
    }
    else {
      lVar25 = 0;
      do {
        auVar56 = *(undefined1 (*) [16])((long)&local_238 + lVar25);
        uVar10 = *(undefined4 *)((long)local_228 + lVar25 + 0x10);
        uVar11 = *(undefined4 *)((long)local_228 + lVar25 + 0x14);
        uVar9 = *(undefined4 *)((long)local_208 + lVar25 + 4);
        auVar83._0_8_ = auVar56._0_8_;
        auVar83._8_4_ = auVar56._4_4_;
        auVar83._12_4_ = *(undefined4 *)((long)local_228 + lVar25 + 4);
        auVar36._0_8_ = CONCAT44(*(undefined4 *)((long)local_228 + lVar25 + 8),auVar56._8_4_);
        auVar36._8_4_ = auVar56._12_4_;
        auVar36._12_4_ = *(undefined4 *)((long)local_228 + lVar25 + 0xc);
        auVar53._0_8_ =
             CONCAT44(*(undefined4 *)((long)local_208 + lVar25 + 8),
                      *(undefined4 *)((long)local_228 + lVar25 + 0x18));
        auVar53._8_4_ = *(undefined4 *)((long)local_228 + lVar25 + 0x1c);
        auVar53._12_4_ = *(undefined4 *)((long)local_1f8 + lVar25 + -4);
        *(ulong *)((long)&local_138 + lVar25) =
             CONCAT44(*(undefined4 *)((long)local_228 + lVar25),auVar56._0_4_);
        *(ulong *)((long)&uStack_130 + lVar25) =
             CONCAT44(*(undefined4 *)((long)local_208 + lVar25),uVar10);
        *(long *)((long)&local_128 + lVar25) = auVar83._8_8_;
        *(undefined4 *)((long)&local_118 + lVar25) = uVar11;
        *(undefined4 *)((long)&local_118 + lVar25 + 4) = uVar9;
        *(undefined8 *)((long)&local_118 + lVar25) = auVar36._0_8_;
        *(undefined8 *)((long)&uStack_110 + lVar25) = auVar53._0_8_;
        *(long *)((long)local_108 + lVar25) = auVar36._8_8_;
        *(long *)((long)local_108 + lVar25 + 8) = auVar53._8_8_;
        lVar25 = lVar25 + 0x40;
      } while (lVar25 != 0x100);
    }
    (*p_Var8)((__m128i *)&local_138,(__m128i *)&local_138,0xc,1,uVar26,0);
    bVar6 = piVar15[1];
    if ((char)bVar6 < '\0') {
      iVar77 = 1 << (~bVar6 & 0x1f);
      lVar25 = 0;
      auVar46 = ZEXT416((uint)-(int)(char)bVar6);
      do {
        auVar53._0_4_ = *(int *)((long)&local_138 + lVar25) + iVar77 >> auVar46;
        auVar53._4_4_ = *(int *)((long)&local_138 + lVar25 + 4) + iVar77 >> auVar46;
        auVar53._8_4_ = *(int *)((long)&uStack_130 + lVar25) + iVar77 >> auVar46;
        auVar53._12_4_ = *(int *)((long)&uStack_130 + lVar25 + 4) + iVar77 >> auVar46;
        *(undefined1 (*) [16])((long)&local_138 + lVar25) = auVar53;
        lVar25 = lVar25 + 0x10;
      } while (lVar25 != 0x100);
    }
    else {
      lVar25 = 0;
      do {
        auVar46._0_4_ = *(int *)((long)&local_138 + lVar25) << (int)(char)bVar6;
        auVar46._4_4_ = *(undefined4 *)((long)&local_138 + lVar25 + 4);
        auVar46._8_4_ = *(undefined4 *)((long)&uStack_130 + lVar25);
        auVar46._12_4_ = *(undefined4 *)((long)&uStack_130 + lVar25 + 4);
        *(undefined1 (*) [16])((long)&local_138 + lVar25) = auVar46;
        lVar25 = lVar25 + 0x10;
      } while (lVar25 != 0x100);
    }
    auVar56 = pmovsxbw(auVar46,0x101010101010101);
    auVar56 = psllw(auVar56,ZEXT416(uVar26));
    lVar25 = 0xf0;
    if ((uVar18 & 1) != 0 || bVar32) {
      lVar25 = 0;
    }
    sVar33 = auVar56._0_2_ + -1;
    sVar38 = auVar56._2_2_ + -1;
    sVar39 = auVar56._4_2_ + -1;
    sVar40 = auVar56._6_2_ + -1;
    sVar41 = auVar56._8_2_ + -1;
    sVar42 = auVar56._10_2_ + -1;
    sVar43 = auVar56._12_2_ + -1;
    sVar44 = auVar56._14_2_ + -1;
    piVar19 = (int *)((long)&local_138 + lVar25);
    lVar25 = 0x10;
    do {
      auVar56 = pmovsxwd(auVar53,*puVar23);
      auVar59._0_4_ = auVar56._0_4_ + *piVar19;
      auVar59._4_4_ = auVar56._4_4_ + piVar19[1];
      auVar59._8_4_ = auVar56._8_4_ + piVar19[2];
      auVar59._12_4_ = auVar56._12_4_ + piVar19[3];
      auVar56 = packusdw(auVar59,auVar59);
      sVar48 = auVar56._0_2_;
      uVar47 = (ushort)(sVar33 < sVar48) * sVar33 | (ushort)(sVar33 >= sVar48) * sVar48;
      sVar48 = auVar56._2_2_;
      uVar60 = (ushort)(sVar38 < sVar48) * sVar38 | (ushort)(sVar38 >= sVar48) * sVar48;
      sVar48 = auVar56._4_2_;
      uVar61 = (ushort)(sVar39 < sVar48) * sVar39 | (ushort)(sVar39 >= sVar48) * sVar48;
      sVar48 = auVar56._6_2_;
      uVar63 = (ushort)(sVar40 < sVar48) * sVar40 | (ushort)(sVar40 >= sVar48) * sVar48;
      sVar48 = auVar56._8_2_;
      uVar64 = (ushort)(sVar41 < sVar48) * sVar41 | (ushort)(sVar41 >= sVar48) * sVar48;
      sVar48 = auVar56._10_2_;
      uVar66 = (ushort)(sVar42 < sVar48) * sVar42 | (ushort)(sVar42 >= sVar48) * sVar48;
      sVar48 = auVar56._12_2_;
      sVar69 = auVar56._14_2_;
      uVar67 = (ushort)(sVar43 < sVar48) * sVar43 | (ushort)(sVar43 >= sVar48) * sVar48;
      uVar70 = (ushort)(sVar44 < sVar69) * sVar44 | (ushort)(sVar44 >= sVar69) * sVar69;
      auVar53._0_8_ =
           CONCAT26((-1 < (short)uVar63) * uVar63,
                    CONCAT24((-1 < (short)uVar61) * uVar61,
                             CONCAT22((-1 < (short)uVar60) * uVar60,(-1 < (short)uVar47) * uVar47)))
      ;
      auVar53._8_2_ = (-1 < (short)uVar64) * uVar64;
      auVar53._10_2_ = (-1 < (short)uVar66) * uVar66;
      auVar53._12_2_ = (-1 < (short)uVar67) * uVar67;
      auVar53._14_2_ = (-1 < (short)uVar70) * uVar70;
      *puVar23 = auVar53._0_8_;
      puVar23 = (undefined8 *)((long)puVar23 + (long)stride * 2);
      piVar19 = (int *)((long)piVar19 + ((ulong)(((byte)((byte)uVar18 | bVar32) & 1) << 5) - 0x10));
      lVar25 = lVar25 + -1;
    } while (lVar25 != 0);
    break;
  case '\x0e':
    iVar77 = txfm_param->bd;
    bVar6 = txfm_param->tx_type;
    uVar17 = (ulong)bVar6;
    bVar27 = ""[uVar17];
    p_Var7 = highbd_txfm_all_1d_zeros_w8_arr[0][""[uVar17]][0];
    palVar31 = (__m128i *)&local_238;
    lVar25 = 0x100;
    memcpy(palVar31,input,0x100);
    (*highbd_txfm_all_1d_zeros_w8_arr[2][bVar27][2])(palVar31,palVar31,0xc,0,iVar77,-(int)*piVar16);
    if ((0x7f1fU >> (bVar6 & 0x1f) & 1) == 0 && 0xf >= uVar17) {
      puVar20 = &local_238;
      palVar31 = (__m128i *)&local_138;
      do {
        auVar34._0_8_ = puVar20[1];
        *(undefined8 *)((long)auStack_148 + lVar25) = *puVar20;
        *(undefined8 *)((long)auStack_148 + lVar25 + 8) = auVar34._0_8_;
        puVar20 = puVar20 + 2;
        lVar25 = lVar25 + -0x10;
      } while (lVar25 != 0);
    }
    pauVar21 = (undefined1 (*) [16])((long)dest * 2);
    local_258 = (byte)(0xbeaf >> (bVar6 & 0x1f));
    local_258 = 0xf < uVar17 | local_258;
    lVar25 = 0;
    do {
      palVar22 = (__m128i *)((long)*palVar31 + lVar25);
      auVar56 = *(undefined1 (*) [16])((long)*palVar31 + lVar25);
      puVar1 = (undefined4 *)((long)palVar31[1] + lVar25);
      puVar2 = (undefined4 *)((long)palVar31[2] + lVar25);
      uVar9 = puVar2[1];
      uVar10 = puVar2[2];
      uVar11 = puVar2[3];
      auVar73 = *(undefined1 (*) [16])((long)palVar31[3] + lVar25);
      auVar81._0_8_ = auVar56._0_8_;
      auVar81._8_4_ = auVar56._4_4_;
      auVar81._12_4_ = puVar1[1];
      auVar51._0_8_ = CONCAT44(puVar1[2],auVar56._8_4_);
      auVar51._8_4_ = auVar56._12_4_;
      auVar51._12_4_ = puVar1[3];
      puVar20 = (undefined8 *)((long)*palVar31 + lVar25);
      *puVar20 = CONCAT44(*puVar1,auVar56._0_4_);
      puVar20[1] = CONCAT44(auVar73._0_4_,*puVar2);
      puVar20 = (undefined8 *)((long)palVar31[1] + lVar25);
      *puVar20 = auVar81._8_8_;
      *(undefined4 *)(puVar20 + 2) = uVar9;
      *(int *)((long)puVar20 + 0x14) = auVar73._4_4_;
      puVar20 = (undefined8 *)((long)palVar31[2] + lVar25);
      *puVar20 = auVar51._0_8_;
      *(undefined4 *)(puVar20 + 1) = uVar10;
      *(int *)((long)puVar20 + 0xc) = auVar73._8_4_;
      puVar20 = (undefined8 *)((long)palVar31[3] + lVar25);
      *puVar20 = auVar51._8_8_;
      *(undefined4 *)(puVar20 + 2) = uVar11;
      *(int *)((long)puVar20 + 0x14) = auVar73._12_4_;
      (*p_Var7)(palVar22,palVar22,0xc,1,iVar77,0);
      lVar25 = lVar25 + 0x40;
    } while (lVar25 != 0x100);
    bVar6 = piVar16[1];
    if ((char)bVar6 < '\0') {
      iVar71 = 1 << (~bVar6 & 0x1f);
      lVar25 = 0;
      auVar56 = ZEXT416((uint)-(int)(char)bVar6);
      do {
        piVar19 = (int *)((long)*palVar31 + lVar25);
        iVar79 = piVar19[1];
        iVar78 = piVar19[2];
        iVar49 = piVar19[3];
        piVar29 = (int *)((long)*palVar31 + lVar25);
        *piVar29 = *piVar19 + iVar71 >> auVar56;
        piVar29[1] = iVar79 + iVar71 >> auVar56;
        piVar29[2] = iVar78 + iVar71 >> auVar56;
        piVar29[3] = iVar49 + iVar71 >> auVar56;
        lVar25 = lVar25 + 0x10;
      } while (lVar25 != 0x100);
    }
    else {
      lVar25 = 0;
      do {
        piVar19 = (int *)((long)*palVar31 + lVar25);
        iVar71 = piVar19[1];
        iVar79 = piVar19[2];
        iVar78 = piVar19[3];
        piVar29 = (int *)((long)*palVar31 + lVar25);
        *piVar29 = *piVar19 << (int)(char)bVar6;
        piVar29[1] = iVar71;
        piVar29[2] = iVar79;
        piVar29[3] = iVar78;
        lVar25 = lVar25 + 0x10;
      } while (lVar25 != 0x100);
    }
    uVar26 = ~(-1 << ((byte)iVar77 & 0x1f));
    piVar19 = (int *)((long)palVar31[4] + (ulong)(((byte)~local_258 & 1) * 0x30));
    lVar25 = 0;
    do {
      lVar28 = 4;
      piVar29 = piVar19;
      pauVar30 = pauVar21;
      do {
        auVar56 = *pauVar30;
        auVar73 = pmovsxwd(auVar73,auVar56);
        auVar56._0_8_ = auVar56._8_8_;
        iVar71 = auVar73._0_4_ + piVar29[-0x10];
        iVar77 = auVar73._4_4_ + piVar29[-0xf];
        iVar78 = auVar73._8_4_ + piVar29[-0xe];
        iVar79 = auVar73._12_4_ + piVar29[-0xd];
        auVar56 = pmovsxwd(auVar56,auVar56);
        iVar49 = auVar56._0_4_ + *piVar29;
        iVar62 = auVar56._4_4_ + piVar29[1];
        iVar65 = auVar56._8_4_ + piVar29[2];
        iVar68 = auVar56._12_4_ + piVar29[3];
        iVar71 = (uint)(-1 < iVar71) * iVar71;
        iVar77 = (uint)(-1 < iVar77) * iVar77;
        iVar78 = (uint)(-1 < iVar78) * iVar78;
        iVar79 = (uint)(-1 < iVar79) * iVar79;
        auVar74._0_4_ = ((int)uVar26 < iVar71) * uVar26 | (uint)((int)uVar26 >= iVar71) * iVar71;
        auVar74._4_4_ = ((int)uVar26 < iVar77) * uVar26 | (uint)((int)uVar26 >= iVar77) * iVar77;
        auVar74._8_4_ = ((int)uVar26 < iVar78) * uVar26 | (uint)((int)uVar26 >= iVar78) * iVar78;
        auVar74._12_4_ = ((int)uVar26 < iVar79) * uVar26 | (uint)((int)uVar26 >= iVar79) * iVar79;
        iVar49 = (uint)(-1 < iVar49) * iVar49;
        iVar62 = (uint)(-1 < iVar62) * iVar62;
        iVar65 = (uint)(-1 < iVar65) * iVar65;
        iVar68 = (uint)(-1 < iVar68) * iVar68;
        auVar73._0_4_ = ((int)uVar26 < iVar49) * uVar26 | (uint)((int)uVar26 >= iVar49) * iVar49;
        auVar73._4_4_ = ((int)uVar26 < iVar62) * uVar26 | (uint)((int)uVar26 >= iVar62) * iVar62;
        auVar73._8_4_ = ((int)uVar26 < iVar65) * uVar26 | (uint)((int)uVar26 >= iVar65) * iVar65;
        auVar73._12_4_ = ((int)uVar26 < iVar68) * uVar26 | (uint)((int)uVar26 >= iVar68) * iVar68;
        auVar73 = packusdw(auVar74,auVar73);
        *pauVar30 = auVar73;
        pauVar30 = (undefined1 (*) [16])(*pauVar30 + (long)stride * 2);
        piVar29 = (int *)((long)piVar29 + ((ulong)((local_258 & 1) << 5) - 0x10));
        lVar28 = lVar28 + -1;
      } while (lVar28 != 0);
      lVar25 = lVar25 + 1;
      pauVar21 = pauVar21 + 1;
      piVar19 = piVar19 + 0x20;
    } while (lVar25 != 2);
  }
  return;
}

Assistant:

void av1_highbd_inv_txfm_add_sse4_1(const tran_low_t *input, uint8_t *dest,
                                    int stride, const TxfmParam *txfm_param) {
  assert(av1_ext_tx_used[txfm_param->tx_set_type][txfm_param->tx_type]);
  const TX_SIZE tx_size = txfm_param->tx_size;
  switch (tx_size) {
    case TX_8X8:
      av1_highbd_inv_txfm_add_8x8_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_4X8:
      av1_highbd_inv_txfm_add_4x8_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_8X4:
      av1_highbd_inv_txfm_add_8x4_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_4X4:
      av1_highbd_inv_txfm_add_4x4_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_16X4:
      av1_highbd_inv_txfm_add_16x4_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_4X16:
      av1_highbd_inv_txfm_add_4x16_sse4_1(input, dest, stride, txfm_param);
      break;
    default:
      av1_highbd_inv_txfm2d_add_universe_sse4_1(
          input, dest, stride, txfm_param->tx_type, tx_size, txfm_param->eob,
          txfm_param->bd);
      break;
  }
}